

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

SDL_bool Surface20to12InPlace(SDL_Surface *surface20,SDL12_Surface *surface12)

{
  byte *pbVar1;
  uint uVar2;
  SDL_Palette *pSVar3;
  SDL_PixelFormat *pSVar4;
  Uint8 UVar5;
  Uint8 UVar6;
  Uint8 UVar7;
  Uint8 UVar8;
  Uint8 UVar9;
  Uint8 UVar10;
  Uint8 UVar11;
  Uint32 UVar12;
  Uint32 UVar13;
  Uint32 UVar14;
  int iVar15;
  SDL12_Palette *pSVar16;
  SDL12_PixelFormat *pSVar17;
  SDL_BlendMode blendmode;
  
  blendmode = SDL_BLENDMODE_NONE;
  if (surface20 == (SDL_Surface *)0x0) {
    return SDL_FALSE;
  }
  if (0xffff < surface20->pitch) {
    (*SDL20_SetError)("Pitch is too large");
    return SDL_FALSE;
  }
  if (surface20->format->palette == (SDL_Palette *)0x0) {
    pSVar16 = (SDL12_Palette *)0x0;
  }
  else {
    pSVar16 = (SDL12_Palette *)(*SDL20_malloc)(0x10);
    if (pSVar16 == (SDL12_Palette *)0x0) {
      pSVar16 = (SDL12_Palette *)0x0;
      goto LAB_0011500b;
    }
  }
  pSVar17 = (SDL12_PixelFormat *)(*SDL20_malloc)(0x30);
  if (pSVar17 != (SDL12_PixelFormat *)0x0) {
    if (pSVar16 != (SDL12_Palette *)0x0) {
      (*SDL20_memset)(pSVar16,0,0x10);
      pSVar3 = surface20->format->palette;
      pSVar16->ncolors = pSVar3->ncolors;
      pSVar16->colors = pSVar3->colors;
    }
    (*SDL20_memset)(pSVar17,0,0x30);
    pSVar17->palette = pSVar16;
    pSVar4 = surface20->format;
    pSVar17->BitsPerPixel = pSVar4->BitsPerPixel;
    pSVar17->BytesPerPixel = pSVar4->BytesPerPixel;
    UVar5 = pSVar4->Gloss;
    UVar6 = pSVar4->Bloss;
    UVar7 = pSVar4->Aloss;
    UVar8 = pSVar4->Rshift;
    UVar9 = pSVar4->Gshift;
    UVar10 = pSVar4->Bshift;
    UVar11 = pSVar4->Ashift;
    pSVar17->Rloss = pSVar4->Rloss;
    pSVar17->Gloss = UVar5;
    pSVar17->Bloss = UVar6;
    pSVar17->Aloss = UVar7;
    pSVar17->Rshift = UVar8;
    pSVar17->Gshift = UVar9;
    pSVar17->Bshift = UVar10;
    pSVar17->Ashift = UVar11;
    UVar12 = pSVar4->Gmask;
    UVar13 = pSVar4->Bmask;
    UVar14 = pSVar4->Amask;
    pSVar17->Rmask = pSVar4->Rmask;
    pSVar17->Gmask = UVar12;
    pSVar17->Bmask = UVar13;
    pSVar17->Amask = UVar14;
    iVar15 = (*SDL20_GetColorKey)(surface20,&pSVar17->colorkey);
    if (iVar15 < 0) {
      pSVar17->colorkey = 0;
    }
    else {
      pbVar1 = (byte *)((long)&surface12->flags + 1);
      *pbVar1 = *pbVar1 | 0x10;
    }
    iVar15 = (*SDL20_GetSurfaceAlphaMod)(surface20,&pSVar17->alpha);
    if (iVar15 < 0) {
      pSVar17->alpha = 0xff;
    }
    (*SDL20_memset)(surface12,0,0x58);
    uVar2 = surface20->flags;
    if ((uVar2 & 1) != 0) {
      pbVar1 = (byte *)((long)&surface12->flags + 3);
      *pbVar1 = *pbVar1 | 1;
    }
    if ((uVar2 & 2) != 0) {
      pbVar1 = (byte *)((long)&surface12->flags + 1);
      *pbVar1 = *pbVar1 | 0x40;
    }
    iVar15 = (*SDL20_GetSurfaceBlendMode)(surface20,&blendmode);
    if ((iVar15 == 0) && (blendmode == SDL_BLENDMODE_BLEND)) {
      pbVar1 = (byte *)((long)&surface12->flags + 2);
      *pbVar1 = *pbVar1 | 1;
    }
    surface12->format = pSVar17;
    iVar15 = surface20->h;
    surface12->w = surface20->w;
    surface12->h = iVar15;
    surface12->pitch = (Uint16)surface20->pitch;
    surface12->pixels = surface20->pixels;
    surface12->offset = 0;
    surface12->surface20 = surface20;
    Rect20to12(&surface20->clip_rect,&surface12->clip_rect);
    surface12->refcount = surface20->refcount;
    return SDL_TRUE;
  }
LAB_0011500b:
  (*SDL20_free)(pSVar16);
  (*SDL20_free)((void *)0x0);
  return SDL_FALSE;
}

Assistant:

static SDL_bool
Surface20to12InPlace(SDL_Surface *surface20,
                     SDL12_Surface *surface12)
{
    SDL_BlendMode blendmode = SDL_BLENDMODE_NONE;
    SDL12_Palette *palette12 = NULL;
    SDL12_PixelFormat *format12 = NULL;
    Uint32 flags = 0;

    if (!surface20) {
        return SDL_FALSE;
    }
    if (surface20->pitch > 65535) {
        SDL20_SetError("Pitch is too large");  /* can't fit to 16-bits */
        return SDL_FALSE;
    }

    if (surface20->format->palette) {
        palette12 = (SDL12_Palette *) SDL20_malloc(sizeof (SDL12_Palette));
        if (!palette12) {
            goto failed;
        }
    }

    format12 = (SDL12_PixelFormat *) SDL20_malloc(sizeof (SDL12_PixelFormat));
    if (!format12) {
        goto failed;
    }

    if (palette12) {
        SDL20_zerop(palette12);
        SDL_assert(surface20->format->palette);
        palette12->ncolors = surface20->format->palette->ncolors;
        palette12->colors = surface20->format->palette->colors;
    }

    SDL20_zerop(format12);
    format12->palette = palette12;
    format12->BitsPerPixel = surface20->format->BitsPerPixel;
    format12->BytesPerPixel = surface20->format->BytesPerPixel;
    format12->Rloss = surface20->format->Rloss;
    format12->Gloss = surface20->format->Gloss;
    format12->Bloss = surface20->format->Bloss;
    format12->Aloss = surface20->format->Aloss;
    format12->Rshift = surface20->format->Rshift;
    format12->Gshift = surface20->format->Gshift;
    format12->Bshift = surface20->format->Bshift;
    format12->Ashift = surface20->format->Ashift;
    format12->Rmask = surface20->format->Rmask;
    format12->Gmask = surface20->format->Gmask;
    format12->Bmask = surface20->format->Bmask;
    format12->Amask = surface20->format->Amask;

    if (SDL20_GetColorKey(surface20, &format12->colorkey) < 0) {
        format12->colorkey = 0;
    } else {
        surface12->flags |= SDL12_SRCCOLORKEY;
    }

    if (SDL20_GetSurfaceAlphaMod(surface20, &format12->alpha) < 0) {
        format12->alpha = 255;
    }

    SDL20_zerop(surface12);
    flags = surface20->flags;
    flags &= ~SDL_SIMD_ALIGNED;  /* we don't need to map this to 1.2 */
    #define MAPSURFACEFLAGS(fl) { if (surface20->flags & SDL_##fl) { surface12->flags |= SDL12_##fl; flags &= ~SDL_##fl; } }
    MAPSURFACEFLAGS(PREALLOC);
    MAPSURFACEFLAGS(RLEACCEL);
    /*MAPSURFACEFLAGS(DONTFREE);*/
    #undef MAPSURFACEFLAGS
    SDL_assert(flags == 0);  /* non-zero if there's a flag we didn't map. */

    if ((SDL20_GetSurfaceBlendMode(surface20, &blendmode) == 0) && (blendmode == SDL_BLENDMODE_BLEND)) {
        surface12->flags |= SDL12_SRCALPHA;
    }

    surface12->format = format12;
    surface12->w = surface20->w;
    surface12->h = surface20->h;
    surface12->pitch = (Uint16) surface20->pitch;
    surface12->pixels = surface20->pixels;
    surface12->offset = 0;
    surface12->surface20 = surface20;
    Rect20to12(&surface20->clip_rect, &surface12->clip_rect);
    surface12->refcount = surface20->refcount;

    return SDL_TRUE;

failed:
    SDL20_free(palette12);
    SDL20_free(format12);
    return SDL_FALSE;
}